

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files_test.c
# Opt level: O0

void test_file_contents(void)

{
  nng_err num;
  int iVar1;
  char *pcVar2;
  undefined1 local_48 [4];
  nng_err result_;
  scratch s;
  size_t len;
  void *data;
  
  memset(local_48,0,0x30);
  make_scratch((scratch *)local_48);
  num = nni_file_get(s.mydir,(void **)&len,(size_t *)&s.d);
  pcVar2 = nng_strerror(num);
  iVar1 = acutest_check_((uint)(num == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xf1,"%s: expected success, got %s (%d)","nni_file_get(s.a, &data, &len)",
                         pcVar2,num);
  if (iVar1 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(s.d == (char *)0x6),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                 ,0xf2,"%s","len == 6");
  iVar1 = strcmp((char *)len,"alpha");
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                 ,0xf3,"%s == %s",len,"alpha",num);
  nni_free((void *)len,(size_t)s.d);
  clean_scratch((scratch *)local_48);
  return;
}

Assistant:

static void
test_file_contents(void)
{
	void          *data;
	size_t         len;
	struct scratch s = { 0 };

	make_scratch(&s);

	NUTS_PASS(nni_file_get(s.a, &data, &len));
	NUTS_TRUE(len == 6);
	NUTS_MATCH(data, "alpha");
	nni_free(data, len);
	clean_scratch(&s);
}